

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O3

TypeNames * __thiscall
wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::getNames
          (TypeNames *__return_storage_ptr__,
          IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *this,HeapType type)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  __node_base_ptr p_Var3;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
  local_28;
  __alloc_node_gen_t __alloc_node_gen;
  HeapType type_local;
  
  __alloc_node_gen._M_h = (__hashtable_alloc *)type.id;
  p_Var3 = std::
           _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->names)._M_h,type.id % (this->names)._M_h._M_bucket_count,
                      (key_type *)&__alloc_node_gen,type.id);
  if ((p_Var3 == (__node_base_ptr)0x0) ||
     (p_Var1 = p_Var3->_M_nxt, p_Var1 == (_Hash_node_base *)0x0)) {
    DefaultTypeNameGenerator::getNames
              (__return_storage_ptr__,this->fallback,(HeapType)__alloc_node_gen._M_h);
  }
  else {
    p_Var2 = p_Var1[3]._M_nxt;
    (__return_storage_ptr__->name).super_IString.str._M_len = (size_t)p_Var1[2]._M_nxt;
    (__return_storage_ptr__->name).super_IString.str._M_str = (char *)p_Var2;
    local_28._M_h = (__hashtable_alloc *)&__return_storage_ptr__->fieldNames;
    (__return_storage_ptr__->fieldNames)._M_h._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->fieldNames)._M_h._M_bucket_count = (size_type)p_Var1[5]._M_nxt;
    (__return_storage_ptr__->fieldNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->fieldNames)._M_h._M_element_count = (size_type)p_Var1[7]._M_nxt;
    p_Var2 = p_Var1[9]._M_nxt;
    *(_Hash_node_base **)&(__return_storage_ptr__->fieldNames)._M_h._M_rehash_policy =
         p_Var1[8]._M_nxt;
    (__return_storage_ptr__->fieldNames)._M_h._M_rehash_policy._M_next_resize = (size_t)p_Var2;
    (__return_storage_ptr__->fieldNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_28._M_h,
               (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(p_Var1 + 4),&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeNames getNames(HeapType type) {
    if (auto it = names.find(type); it != names.end()) {
      return it->second;
    } else {
      return fallback.getNames(type);
    }
  }